

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDate __thiscall QDate::addMonths(QDate *this,int nmonths,QCalendar cal)

{
  QDate date;
  bool bVar1;
  int iVar2;
  QDate QVar3;
  int iVar4;
  qint64 qVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  YearMonthDay YVar10;
  QCalendar local_58;
  QCalendar local_50;
  YearMonthDay local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar5 = -0x8000000000000000;
  date = (QDate)this->jd;
  QVar3.jd = qVar5;
  local_58.d_ptr = cal.d_ptr;
  if ((date.jd + 0xb69eeff91fU < 0x16d3e147974) && (QVar3 = date, nmonths != 0)) {
    YVar10 = QCalendar::partsFromDate(&local_58,date);
    QVar3.jd = qVar5;
    if (YVar10._0_8_ >> 0x20 != 0x80000000) {
      iVar4 = YVar10.month + nmonths;
      uVar7 = CONCAT44(iVar4,YVar10.year);
      if (iVar4 < 1) {
        do {
          iVar4 = (int)uVar7 + -1;
          if ((iVar4 != 0) || (bVar1 = QCalendar::hasYearZero(&local_58), bVar1)) {
            iVar6 = QCalendar::monthsInYear(&local_58,iVar4);
            uVar7 = CONCAT44((int)(uVar7 >> 0x20) + iVar6,iVar4);
          }
          else {
            uVar7 = uVar7 & 0xffffffff00000000;
          }
        } while ((int)(uVar7 >> 0x20) < 1);
      }
      iVar4 = QCalendar::monthsInYear(&local_58,(int)uVar7);
      uVar9 = uVar7 >> 0x20;
      if (iVar4 < (int)(uVar7 >> 0x20)) {
        do {
          iVar6 = (int)uVar7 + 1;
          if (iVar6 == 0) {
            bVar1 = QCalendar::hasYearZero(&local_58);
            iVar2 = 0;
            if (bVar1) goto LAB_0034d7bc;
          }
          else {
LAB_0034d7bc:
            iVar2 = QCalendar::monthsInYear(&local_58,iVar6);
          }
          uVar8 = (int)uVar9 - iVar4;
          uVar9 = (ulong)uVar8;
          uVar7 = CONCAT44(uVar8,(int)uVar7 + 1);
          iVar4 = iVar2;
        } while (iVar2 < (int)uVar8);
      }
      local_50.d_ptr = local_58.d_ptr;
      local_48._0_8_ = uVar7;
      local_48.day = YVar10.day;
      if (((-1 < (int)uVar7) || (bVar1 = QCalendar::isProleptic(&local_50), bVar1)) &&
         ((local_48.year != 0 || (bVar1 = QCalendar::hasYearZero(&local_50), bVar1)))) {
        iVar4 = QCalendar::daysInMonth(&local_50,local_48.month,local_48.year);
        if (local_48.day < iVar4) {
          iVar4 = local_48.day;
        }
        local_48.day = iVar4;
        QVar3 = QCalendar::dateFromParts(&local_50,&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDate)QVar3.jd;
}

Assistant:

QDate QDate::addMonths(int nmonths, QCalendar cal) const
{
    if (!isValid())
        return QDate();

    if (nmonths == 0)
        return *this;

    auto parts = cal.partsFromDate(*this);

    if (!parts.isValid())
        return QDate();
    Q_ASSERT(parts.year || cal.hasYearZero());

    parts.month += nmonths;
    while (parts.month <= 0) {
        if (--parts.year || cal.hasYearZero())
            parts.month += cal.monthsInYear(parts.year);
    }
    int count = cal.monthsInYear(parts.year);
    while (parts.month > count) {
        parts.month -= count;
        count = (++parts.year || cal.hasYearZero()) ? cal.monthsInYear(parts.year) : 0;
    }

    return fixedDate(parts, cal);
}